

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  value_type *pvVar1;
  pointer pTVar2;
  double *pdVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  pointer pTVar12;
  ClipVolumePlane *pCVar13;
  pointer pTVar14;
  pointer pFVar15;
  pointer pFVar16;
  double dVar17;
  value_type *__x;
  pointer pTVar18;
  pointer __first;
  pointer __last;
  double dVar19;
  double dVar20;
  ClipFloat CVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  TextureChannelClass TVar25;
  float fVar26;
  VertexPacket *pVVar27;
  SubTriangle *pSVar28;
  _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  *this;
  pointer pTVar29;
  TriangleVertex *pTVar30;
  TriangleVertex *pTVar31;
  ulong uVar32;
  SubTriangle *pSVar33;
  VertexPacket *pVVar34;
  VertexPacket *pVVar35;
  pointer pfVar36;
  ChannelType channelType;
  allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex> *__alloc;
  value_type *pvVar37;
  allocator<rr::(anonymous_namespace)::cliputil::SubTriangle> *__alloc_00;
  byte bVar38;
  pointer pTVar39;
  pointer pTVar40;
  ulong uVar41;
  pointer pTVar42;
  byte bVar43;
  TriangleVertex *outside_1;
  long lVar44;
  size_t __n;
  value_type *pvVar45;
  long lVar46;
  long lVar47;
  GeometryShader *pGVar48;
  SubTriangle *pSVar49;
  SubTriangle *__cur;
  SubTriangle *pSVar50;
  size_t inputNdx;
  ulong uVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  pointer a;
  double dVar58;
  TriangleVertex *a_00;
  pointer a_01;
  TriangleVertex *a_02;
  undefined4 extraout_XMM0_Db;
  deUint32 u32;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  pointer in_stack_fffffffffffffc38;
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  local_3a8;
  vector<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
  nextPhaseSubTriangles;
  undefined1 local_368 [8];
  undefined8 uStack_360;
  pointer local_358;
  double dStack_350;
  undefined8 local_348;
  Program *local_338;
  vector<float,_std::allocator<float>_> depthValues;
  ClipVec4 anotherPointOnLine;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> outputTriangles;
  ClipVec4 approximatedClipPoint;
  TriangleVertex mid2;
  ComponentPlane<1,_0> clipPosX;
  float local_1d8;
  float local_1d4;
  IVec4 renderTargetRect;
  IVec4 local_1c0;
  bool clippedByPlane [6];
  Vector<float,_2> local_180;
  TriangleVertex mid1;
  FaceType local_c8;
  ClipVolumePlane *planes [6];
  ComponentPlane<_1,_2> clipNegZ;
  ComponentPlane<1,_2> clipPosZ;
  ComponentPlane<_1,_1> clipNegY;
  ComponentPlane<1,_1> clipPosY;
  ComponentPlane<_1,_0> clipNegX;
  anon_unknown_19 local_38 [8];
  
  bVar7 = (state->fragOps).depthClampEnabled;
  pGVar48 = (GeometryShader *)&program->vertexShader->m_outputs;
  if (program->geometryShader != (GeometryShader *)0x0) {
    pGVar48 = program->geometryShader + 0x38;
  }
  uVar51 = 0;
  local_338 = program;
  while( true ) {
    if ((ulong)((long)*(pointer *)(pGVar48 + 8) - *(long *)pGVar48 >> 3) <= uVar51) break;
    if (*(char *)(*(long *)pGVar48 + 4 + uVar51 * 8) == '\x01') {
      for (pTVar42 = (primList->
                     super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          pTVar42 !=
          (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
          _M_impl.super__Vector_impl_data._M_finish; pTVar42 = pTVar42 + 1) {
        pVVar27 = pa::Triangle::getProvokingVertex(pTVar42);
        dVar8 = pVVar27->outputs[uVar51].v.uData[0];
        dVar9 = pVVar27->outputs[uVar51].v.uData[1];
        dVar10 = pVVar27->outputs[uVar51].v.uData[2];
        dVar11 = pVVar27->outputs[uVar51].v.uData[3];
        pVVar27 = pTVar42->v0;
        pVVar27->outputs[uVar51].v.uData[0] = dVar8;
        pVVar27->outputs[uVar51].v.uData[1] = dVar9;
        pVVar27->outputs[uVar51].v.uData[2] = dVar10;
        pVVar27->outputs[uVar51].v.uData[3] = dVar11;
        pVVar27 = pTVar42->v1;
        pVVar27->outputs[uVar51].v.uData[0] = dVar8;
        pVVar27->outputs[uVar51].v.uData[1] = dVar9;
        pVVar27->outputs[uVar51].v.uData[2] = dVar10;
        pVVar27->outputs[uVar51].v.uData[3] = dVar11;
        pVVar27 = pTVar42->v2;
        pVVar27->outputs[uVar51].v.uData[0] = dVar8;
        pVVar27->outputs[uVar51].v.uData[1] = dVar9;
        pVVar27->outputs[uVar51].v.uData[2] = dVar10;
        pVVar27->outputs[uVar51].v.uData[3] = dVar11;
      }
    }
    uVar51 = uVar51 + 1;
  }
  clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e1278;
  clipNegX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e12c8;
  clipPosY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e1308;
  clipNegY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e1348;
  clipPosZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e1388;
  clipNegZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_003e13c8;
  pGVar48 = (GeometryShader *)&local_338->vertexShader->m_outputs;
  if (local_338->geometryShader != (GeometryShader *)0x0) {
    pGVar48 = local_338->geometryShader + 0x38;
  }
  planes[0] = &clipPosX.super_ClipVolumePlane;
  planes[1] = &clipNegX.super_ClipVolumePlane;
  planes[2] = &clipPosY.super_ClipVolumePlane;
  planes[3] = &clipNegY.super_ClipVolumePlane;
  planes[4] = &clipPosZ.super_ClipVolumePlane;
  planes[5] = &clipNegZ.super_ClipVolumePlane;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (pointer)((ulong)(bVar7 ^ 1) * 2 + 4);
  lVar47 = 0;
  while( true ) {
    pTVar42 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar12 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)pTVar12 - (long)pTVar42) >> 5) <= lVar47) break;
    bVar43 = 1;
    for (pTVar39 = (pointer)0x0; pTVar2 != pTVar39;
        pTVar39 = (pointer)((long)(pTVar39->position).m_data + 1)) {
      pCVar13 = planes[(long)pTVar39];
      pVVar27 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar47].v0;
      uVar5 = *(undefined8 *)(pVVar27->position).m_data;
      mid1.position.m_data[0] = (double)(float)uVar5;
      mid1.position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)((pVVar27->position).m_data + 2);
      mid1.position.m_data[2] = (double)(float)uVar5;
      mid1.position.m_data[3] = (double)(float)((ulong)uVar5 >> 0x20);
      iVar22 = (**pCVar13->_vptr_ClipVolumePlane)(pCVar13,&mid1);
      pVVar27 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar47].v1;
      uVar5 = *(undefined8 *)(pVVar27->position).m_data;
      mid1.position.m_data[0] = (double)(float)uVar5;
      mid1.position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)((pVVar27->position).m_data + 2);
      mid1.position.m_data[2] = (double)(float)uVar5;
      mid1.position.m_data[3] = (double)(float)((ulong)uVar5 >> 0x20);
      iVar23 = (**pCVar13->_vptr_ClipVolumePlane)(pCVar13,&mid1);
      pVVar27 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar47].v2;
      uVar5 = *(undefined8 *)(pVVar27->position).m_data;
      mid1.position.m_data[0] = (double)(float)uVar5;
      mid1.position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)((pVVar27->position).m_data + 2);
      mid1.position.m_data[2] = (double)(float)uVar5;
      mid1.position.m_data[3] = (double)(float)((ulong)uVar5 >> 0x20);
      iVar24 = (**pCVar13->_vptr_ClipVolumePlane)(pCVar13);
      in_stack_fffffffffffffc38 = pTVar39;
      if (((byte)iVar22 == 0 && (byte)iVar23 == 0) && (byte)iVar24 == 0) goto LAB_002e1d4e;
      bVar38 = (byte)iVar22 & (byte)iVar23 & (byte)iVar24;
      bVar43 = bVar43 & bVar38;
      clippedByPlane[(long)pTVar39] = (bool)(bVar38 ^ 1);
    }
    if (bVar43 == 0) {
      pSVar28 = (SubTriangle *)operator_new(0xa8);
      depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(pSVar28 + 1);
      bVar7 = true;
      pSVar33 = pSVar28;
      depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pSVar28;
      while (bVar7) {
        bVar7 = false;
        memset(pSVar33,0,0xa8);
        anon_unknown_19::cliputil::SubTriangle::SubTriangle(pSVar33);
        pSVar33 = pSVar33 + 1;
      }
      pTVar42 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)((pTVar42[lVar47].v0)->position).m_data;
      uVar6 = *(undefined8 *)(((pTVar42[lVar47].v0)->position).m_data + 2);
      pSVar28->vertices[0].position.m_data[0] = (double)(float)uVar5;
      pSVar28->vertices[0].position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      pSVar28->vertices[0].position.m_data[2] = (double)(float)uVar6;
      pSVar28->vertices[0].position.m_data[3] = (double)(float)((ulong)uVar6 >> 0x20);
      pSVar28->vertices[0].weight[0] = 1.0;
      *(undefined1 (*) [16])(pSVar28->vertices[0].weight + 1) = ZEXT816(0);
      uVar5 = *(undefined8 *)((pTVar42[lVar47].v1)->position).m_data;
      uVar6 = *(undefined8 *)(((pTVar42[lVar47].v1)->position).m_data + 2);
      pSVar28->vertices[1].position.m_data[0] = (double)(float)uVar5;
      pSVar28->vertices[1].position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      pSVar28->vertices[1].position.m_data[2] = (double)(float)uVar6;
      pSVar28->vertices[1].position.m_data[3] = (double)(float)((ulong)uVar6 >> 0x20);
      pSVar28->vertices[1].weight[0] = 0.0;
      pSVar28->vertices[1].weight[1] = 1.0;
      pSVar28->vertices[1].weight[2] = 0.0;
      uVar5 = *(undefined8 *)((pTVar42[lVar47].v2)->position).m_data;
      uVar6 = *(undefined8 *)(((pTVar42[lVar47].v2)->position).m_data + 2);
      auVar59._0_8_ = (double)(float)uVar6;
      auVar59._8_8_ = (double)(float)((ulong)uVar6 >> 0x20);
      pSVar28->vertices[2].position.m_data[0] = (double)(float)uVar5;
      pSVar28->vertices[2].position.m_data[1] = (double)(float)((ulong)uVar5 >> 0x20);
      *(undefined1 (*) [16])(pSVar28->vertices[2].position.m_data + 2) = auVar59;
      *(undefined1 (*) [16])pSVar28->vertices[2].weight = ZEXT816(0);
      pSVar28->vertices[2].weight[2] = 1.0;
      depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)pSVar33;
      for (pTVar39 = (pointer)0x0; pTVar39 != pTVar2;
          pTVar39 = (pointer)((long)(pTVar39->position).m_data + 1)) {
        nextPhaseSubTriangles.
        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        nextPhaseSubTriangles.
        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nextPhaseSubTriangles.
        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (clippedByPlane[(long)pTVar39] == true) {
          pSVar49 = pSVar28;
          pSVar50 = pSVar33;
          for (lVar46 = 0;
              pfVar36 = depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
              lVar46 < (int)(((long)pSVar50 - (long)pSVar49) / 0xa8); lVar46 = lVar46 + 1) {
            local_3a8.
            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
            ._M_impl.super__Vector_impl_data._M_start = (TriangleVertex *)0x0;
            local_3a8.
            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
            ._M_impl.super__Vector_impl_data._M_finish = (TriangleVertex *)0x0;
            local_3a8.
            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            in_stack_fffffffffffffc38 = pSVar49[lVar46].vertices;
            pCVar13 = planes[(long)pTVar39];
            iVar22 = (**pCVar13->_vptr_ClipVolumePlane)
                               (pCVar13,in_stack_fffffffffffffc38,
                                ((long)pSVar50 - (long)pSVar49) % 0xa8);
            pvVar45 = in_stack_fffffffffffffc38 + 1;
            iVar23 = (**pCVar13->_vptr_ClipVolumePlane)(pCVar13,pvVar45);
            pvVar1 = in_stack_fffffffffffffc38 + 2;
            iVar24 = (**pCVar13->_vptr_ClipVolumePlane)(pCVar13,pvVar1);
            pTVar40 = local_3a8.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar31 = local_3a8.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pTVar18 = local_3a8.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar43 = (byte)iVar22;
            bVar38 = (byte)iVar23;
            iVar22 = (uint)(byte)((byte)iVar24 ^ 1) + (uint)(bVar38 ^ 1) + (uint)(bVar43 ^ 1);
            if (iVar22 == 2) {
              pTVar31 = pvVar45;
              pvVar37 = in_stack_fffffffffffffc38;
              __x = pvVar1;
              if (bVar38 != 0) {
                pTVar31 = in_stack_fffffffffffffc38;
                pvVar37 = pvVar1;
                __x = pvVar45;
              }
              if (bVar43 != 0) {
                pTVar31 = pvVar1;
                pvVar37 = pvVar45;
                __x = in_stack_fffffffffffffc38;
              }
              tcu::Vector<double,_4>::Vector(&mid1.position);
              tcu::Vector<double,_4>::Vector(&mid2.position);
              (*pCVar13->_vptr_ClipVolumePlane[1])(pCVar13,__x,pvVar37);
              if ((double)a_01 < 1.0) {
                tcu::mix<4>(&approximatedClipPoint,&__x->position,&pvVar37->position,(double)a_01);
                pvVar45 = pvVar37;
                if (0.5 < (double)a_01) {
                  pvVar45 = __x;
                }
                tcu::Vector<double,_4>::Vector(&anotherPointOnLine,&pvVar45->position);
                (*pCVar13->_vptr_ClipVolumePlane[2])
                          (local_368,pCVar13,&approximatedClipPoint,&anotherPointOnLine);
                mid1.position.m_data[3] = dStack_350;
                mid1.position.m_data[0] = (double)local_368;
                dVar58 = 1.0 - (double)a_01;
                mid1.weight[0] = dVar58 * __x->weight[0] + (double)a_01 * pvVar37->weight[0];
                mid1.weight[1] = dVar58 * __x->weight[1] + (double)a_01 * pvVar37->weight[1];
                mid1.weight[2] = dVar58 * __x->weight[2] + pvVar37->weight[2] * (double)a_01;
                mid1.position.m_data[1] = (double)uStack_360;
                mid1.position.m_data[2] = (double)local_358;
              }
              (*pCVar13->_vptr_ClipVolumePlane[1])(pCVar13,__x,pTVar31);
              if ((double)a_02 < 1.0) {
                local_348 = a_02;
                tcu::mix<4>(&approximatedClipPoint,&__x->position,&pTVar31->position,(double)a_02);
                pvVar45 = pTVar31;
                if (0.5 < (double)local_348) {
                  pvVar45 = __x;
                }
                tcu::Vector<double,_4>::Vector(&anotherPointOnLine,&pvVar45->position);
                (*pCVar13->_vptr_ClipVolumePlane[2])
                          (local_368,pCVar13,&approximatedClipPoint,&anotherPointOnLine);
                mid2.position.m_data[2] = (double)local_358;
                mid2.position.m_data[3] = dStack_350;
                mid2.position.m_data[0] = (double)local_368;
                mid2.position.m_data[1] = (double)uStack_360;
                dVar58 = 1.0 - (double)local_348;
                mid2.weight[0] = dVar58 * __x->weight[0] + (double)local_348 * pTVar31->weight[0];
                mid2.weight[1] = dVar58 * __x->weight[1] + (double)local_348 * pTVar31->weight[1];
                mid2.weight[2] = dVar58 * __x->weight[2] + pTVar31->weight[2] * (double)local_348;
                pTVar31 = &mid2;
              }
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,__x);
              if ((double)a_01 < 1.0) {
                pvVar37 = &mid1;
              }
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,pvVar37);
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,pTVar31);
              in_stack_fffffffffffffc38 = a_01;
            }
            else if (iVar22 == 1) {
              pvVar37 = in_stack_fffffffffffffc38;
              pTVar31 = pvVar1;
              pTVar30 = pvVar45;
              if (bVar38 != 0) {
                pvVar37 = pvVar45;
                pTVar31 = in_stack_fffffffffffffc38;
                pTVar30 = pvVar1;
              }
              if (bVar43 == 0) {
                pvVar37 = pvVar1;
                pTVar30 = in_stack_fffffffffffffc38;
                pTVar31 = pvVar45;
              }
              tcu::Vector<double,_4>::Vector(&mid1.position);
              tcu::Vector<double,_4>::Vector(&mid2.position);
              (*pCVar13->_vptr_ClipVolumePlane[1])(pCVar13,pTVar31,pTVar30);
              if ((double)a < 1.0) {
                tcu::mix<4>(&approximatedClipPoint,&pTVar31->position,&pTVar30->position,(double)a);
                pvVar45 = pTVar30;
                if (0.5 < (double)a) {
                  pvVar45 = pTVar31;
                }
                tcu::Vector<double,_4>::Vector(&anotherPointOnLine,&pvVar45->position);
                (*pCVar13->_vptr_ClipVolumePlane[2])
                          (local_368,pCVar13,&approximatedClipPoint,&anotherPointOnLine);
                mid1.position.m_data[3] = dStack_350;
                mid1.position.m_data[0] = (double)local_368;
                dVar58 = 1.0 - (double)a;
                mid1.weight[0] = dVar58 * pTVar31->weight[0] + (double)a * pTVar30->weight[0];
                mid1.weight[1] = dVar58 * pTVar31->weight[1] + (double)a * pTVar30->weight[1];
                mid1.weight[2] = dVar58 * pTVar31->weight[2] + pTVar30->weight[2] * (double)a;
                mid1.position.m_data[1] = (double)uStack_360;
                mid1.position.m_data[2] = (double)local_358;
              }
              (*pCVar13->_vptr_ClipVolumePlane[1])(pCVar13,pvVar37,pTVar30);
              if ((double)a_00 < 1.0) {
                local_348 = a_00;
                tcu::mix<4>(&approximatedClipPoint,&pvVar37->position,&pTVar30->position,
                            (double)a_00);
                pvVar45 = pTVar30;
                if (0.5 < (double)local_348) {
                  pvVar45 = pvVar37;
                }
                tcu::Vector<double,_4>::Vector(&anotherPointOnLine,&pvVar45->position);
                (*pCVar13->_vptr_ClipVolumePlane[2])
                          (local_368,pCVar13,&approximatedClipPoint,&anotherPointOnLine);
                mid2.position.m_data[2] = (double)local_358;
                mid2.position.m_data[3] = dStack_350;
                mid2.position.m_data[0] = (double)local_368;
                mid2.position.m_data[1] = (double)uStack_360;
                dVar58 = 1.0 - (double)local_348;
                mid2.weight[0] =
                     dVar58 * pvVar37->weight[0] + (double)local_348 * pTVar30->weight[0];
                mid2.weight[1] =
                     dVar58 * pvVar37->weight[1] + (double)local_348 * pTVar30->weight[1];
                mid2.weight[2] =
                     dVar58 * pvVar37->weight[2] + pTVar30->weight[2] * (double)local_348;
                if ((double)a < 1.0) {
                  std::
                  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ::push_back(&local_3a8,pTVar31);
                  pTVar31 = &mid1;
                  pTVar30 = &mid2;
                }
              }
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,pTVar31);
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,pTVar30);
              std::
              vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ::push_back(&local_3a8,pvVar37);
              in_stack_fffffffffffffc38 = a;
            }
            else if (iVar22 == 0) {
              __alloc = (allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex> *)0xa8;
              local_348 = in_stack_fffffffffffffc38 + 3;
              if ((ulong)((long)local_3a8.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_3a8.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish) < 0xa8) {
                __n = 3;
                this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        *)std::
                          vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                          ::_M_check_len(&local_3a8,3,"vector::_M_range_insert");
                pTVar29 = std::
                          _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                          ::_M_allocate(this,__n);
                pTVar30 = std::
                          __uninitialized_copy_a<rr::(anonymous_namespace)::cliputil::TriangleVertex_const*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex>
                                    (pTVar18,pTVar18,pTVar29,__alloc);
                pTVar30 = std::
                          __uninitialized_copy_a<rr::(anonymous_namespace)::cliputil::TriangleVertex_const*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex>
                                    (in_stack_fffffffffffffc38,local_348,pTVar30,__alloc);
                pTVar31 = std::
                          __uninitialized_copy_a<rr::(anonymous_namespace)::cliputil::TriangleVertex_const*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex>
                                    (pTVar18,pTVar31,pTVar30,__alloc);
                std::
                _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::_M_deallocate((_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 *)pTVar18,(pointer)(((long)pTVar40 - (long)pTVar18) / 0x38),
                                ((long)pTVar40 - (long)pTVar18) % 0x38);
                local_3a8.
                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar29 + (long)this;
                local_3a8.
                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ._M_impl.super__Vector_impl_data._M_start = pTVar29;
                local_3a8.
                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish = pTVar31;
              }
              else {
                lVar44 = (long)local_3a8.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_3a8.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(lVar44 / 0x38) < 4) {
                  std::
                  __uninitialized_copy_a<rr::(anonymous_namespace)::cliputil::TriangleVertex_const*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex>
                            ((TriangleVertex *)(lVar44 + (long)in_stack_fffffffffffffc38),local_348,
                             local_3a8.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex> *)0xa8)
                  ;
                  std::
                  __uninitialized_move_a<rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>>
                            (pTVar18,pTVar31,pTVar31 + (3 - lVar44 / 0x38),__alloc);
                  local_3a8.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((long)(pTVar31 + (3 - lVar44 / 0x38)) + lVar44);
                  pTVar30 = (TriangleVertex *)(lVar44 + (long)in_stack_fffffffffffffc38);
                }
                else {
                  pTVar30 = local_3a8.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -3;
                  std::
                  __uninitialized_move_a<rr::(anonymous_namespace)::cliputil::TriangleVertex*,rr::(anonymous_namespace)::cliputil::TriangleVertex*,std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>>
                            (pTVar30,local_3a8.
                                     super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                             local_3a8.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex> *)0xa8)
                  ;
                  local_3a8.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pTVar31 + 3;
                  for (lVar44 = ((long)pTVar30 - (long)pTVar18) / 0x38; pTVar30 = local_348,
                      0 < lVar44; lVar44 = lVar44 + -1) {
                    pTVar31[-1].weight[2] = pTVar31[-4].weight[2];
                    dVar58 = pTVar31[-4].position.m_data[0];
                    dVar17 = pTVar31[-4].position.m_data[1];
                    auVar59 = *(undefined1 (*) [16])(pTVar31[-4].position.m_data + 2);
                    *(undefined1 (*) [16])pTVar31[-1].weight =
                         *(undefined1 (*) [16])pTVar31[-4].weight;
                    *(undefined1 (*) [16])(pTVar31[-1].position.m_data + 2) = auVar59;
                    pTVar31[-1].position.m_data[0] = dVar58;
                    pTVar31[-1].position.m_data[1] = dVar17;
                    pTVar31 = pTVar31 + -1;
                  }
                }
                std::
                copy<rr::(anonymous_namespace)::cliputil::TriangleVertex_const*,__gnu_cxx::__normal_iterator<rr::(anonymous_namespace)::cliputil::TriangleVertex*,std::vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>>>>
                          (in_stack_fffffffffffffc38,pTVar30,
                           (__normal_iterator<rr::(anonymous_namespace)::cliputil::TriangleVertex_*,_std::vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>_>
                            )pTVar18);
              }
            }
            pTVar18 = local_3a8.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_3a8.
                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_3a8.
                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar44 = 1;
              pTVar40 = local_3a8.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              in_stack_fffffffffffffc38 =
                   local_3a8.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              do {
                pTVar29 = in_stack_fffffffffffffc38 + lVar44;
                do {
                  lVar44 = lVar44 + 1;
                  if ((int)(((long)pTVar40 - (long)in_stack_fffffffffffffc38) / 0x38) <= lVar44)
                  goto LAB_002e181e;
                  mid1.position.m_data[1]._0_4_ = (float)(pTVar29->position).m_data[2];
                  mid1.position.m_data[1]._4_4_ = (float)(pTVar29->position).m_data[3];
                  mid1.position.m_data[0] =
                       (double)CONCAT44((float)(pTVar29->position).m_data[1],
                                        (float)(pTVar29->position).m_data[0]);
                  anon_unknown_19::to2DCartesian((anon_unknown_19 *)&local_1c0,(Vec4 *)&mid1);
                  mid2.position.m_data[1] =
                       (double)CONCAT44((float)(pTVar18->position).m_data[3],
                                        (float)(pTVar18->position).m_data[2]);
                  mid2.position.m_data[0] =
                       (double)CONCAT44((float)(pTVar18->position).m_data[1],
                                        (float)(pTVar18->position).m_data[0]);
                  anon_unknown_19::to2DCartesian((anon_unknown_19 *)&renderTargetRect,(Vec4 *)&mid2)
                  ;
                  tcu::operator-((Vector<float,_2> *)&local_1c0,
                                 (Vector<float,_2> *)&renderTargetRect);
                  approximatedClipPoint.m_data[1] =
                       (double)CONCAT44((float)pTVar29[1].position.m_data[3],
                                        (float)pTVar29[1].position.m_data[2]);
                  approximatedClipPoint.m_data[0] =
                       (double)CONCAT44((float)pTVar29[1].position.m_data[1],
                                        (float)pTVar29[1].position.m_data[0]);
                  anon_unknown_19::to2DCartesian
                            ((anon_unknown_19 *)&local_180,(Vec4 *)&approximatedClipPoint);
                  anotherPointOnLine.m_data[1] =
                       (double)CONCAT44((float)(pTVar18->position).m_data[3],
                                        (float)(pTVar18->position).m_data[2]);
                  anotherPointOnLine.m_data[0] =
                       (double)CONCAT44((float)(pTVar18->position).m_data[1],
                                        (float)(pTVar18->position).m_data[0]);
                  anon_unknown_19::to2DCartesian(local_38,(Vec4 *)&anotherPointOnLine);
                  tcu::operator-(&local_180,(Vector<float,_2> *)local_38);
                  pTVar29 = pTVar29 + 1;
                  fVar53 = (float)local_368._0_4_ * local_1d4 - (float)local_368._4_4_ * local_1d8;
                  auVar60._0_4_ = -fVar53;
                  auVar60._4_4_ = 0x80000000;
                  auVar60._8_4_ = 0x80000000;
                  auVar60._12_4_ = 0x80000000;
                  if (auVar60._0_4_ <= fVar53) {
                    auVar60._0_4_ = fVar53;
                  }
                } while (auVar60._0_4_ < 1e-06);
                anon_unknown_19::cliputil::SubTriangle::SubTriangle((SubTriangle *)&mid1);
                __last = nextPhaseSubTriangles.
                         super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                __first = nextPhaseSubTriangles.
                          super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                mid1.weight[2] = pTVar18->weight[2];
                mid1.position.m_data[0] = (pTVar18->position).m_data[0];
                dVar58 = (pTVar18->position).m_data[1];
                dVar17 = (pTVar18->position).m_data[2];
                mid1.position.m_data[3] = (pTVar18->position).m_data[3];
                mid1.weight._0_16_ = *(undefined1 (*) [16])pTVar18->weight;
                mid1.position.m_data[2]._0_4_ = SUB84(dVar17,0);
                mid1.position.m_data[2]._4_4_ = (undefined4)((ulong)dVar17 >> 0x20);
                mid1.position.m_data[1]._0_4_ = SUB84(dVar58,0);
                mid1.position.m_data[1]._4_4_ = (float)((ulong)dVar58 >> 0x20);
                if (nextPhaseSubTriangles.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    nextPhaseSubTriangles.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  if ((long)nextPhaseSubTriangles.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)nextPhaseSubTriangles.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
                    std::__throw_length_error("vector::_M_realloc_insert");
                  }
                  uVar32 = ((long)nextPhaseSubTriangles.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)nextPhaseSubTriangles.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xa8;
                  uVar51 = uVar32;
                  if (nextPhaseSubTriangles.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      nextPhaseSubTriangles.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    uVar51 = 1;
                  }
                  uVar41 = uVar51 + uVar32;
                  __alloc_00 = (allocator<rr::(anonymous_namespace)::cliputil::SubTriangle> *)
                               0xc30c30c30c30c3;
                  if (0xc30c30c30c30c2 < uVar41) {
                    uVar41 = 0xc30c30c30c30c3;
                  }
                  if (CARRY8(uVar51,uVar32)) {
                    uVar41 = 0xc30c30c30c30c3;
                  }
                  if (uVar41 == 0) {
                    pSVar28 = (SubTriangle *)0x0;
                  }
                  else {
                    pSVar28 = (SubTriangle *)operator_new(uVar41 * 0xa8);
                  }
                  anon_unknown_19::cliputil::SubTriangle::SubTriangle
                            (pSVar28 + uVar32,(SubTriangle *)&mid1);
                  pSVar33 = std::
                            __uninitialized_move_if_noexcept_a<rr::(anonymous_namespace)::cliputil::SubTriangle*,rr::(anonymous_namespace)::cliputil::SubTriangle*,std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>>
                                      (__first,__last,pSVar28,__alloc_00);
                  pSVar33 = std::
                            __uninitialized_move_if_noexcept_a<rr::(anonymous_namespace)::cliputil::SubTriangle*,rr::(anonymous_namespace)::cliputil::SubTriangle*,std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>>
                                      (__last,__last,pSVar33 + 1,
                                       (allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>
                                        *)0xa8);
                  std::
                  _Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                  ::_M_deallocate((_Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                   *)__first,
                                  (pointer)(((long)nextPhaseSubTriangles.
                                                                                                      
                                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)__first) / 0xa8),
                                  ((long)nextPhaseSubTriangles.
                                         super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first) % 0xa8);
                  nextPhaseSubTriangles.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar28 + uVar41;
                  pTVar40 = local_3a8.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  in_stack_fffffffffffffc38 =
                       local_3a8.
                       super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  nextPhaseSubTriangles.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start = pSVar28;
                  nextPhaseSubTriangles.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pSVar33;
                }
                else {
                  anon_unknown_19::cliputil::SubTriangle::SubTriangle
                            (nextPhaseSubTriangles.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(SubTriangle *)&mid1);
                  nextPhaseSubTriangles.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __last + 1;
                }
              } while( true );
            }
LAB_002e181e:
            std::
            vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
            ::~vector(&local_3a8);
            pSVar49 = (SubTriangle *)
                      depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pSVar50 = (SubTriangle *)
                      depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)nextPhaseSubTriangles.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)nextPhaseSubTriangles.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)nextPhaseSubTriangles.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          nextPhaseSubTriangles.
          super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar36;
          pSVar28 = nextPhaseSubTriangles.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar33 = nextPhaseSubTriangles.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          nextPhaseSubTriangles.
          super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar49;
          nextPhaseSubTriangles.
          super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar50;
        }
        std::
        vector<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
        ::~vector(&nextPhaseSubTriangles);
      }
      for (lVar46 = 0; lVar46 < (int)(((long)pSVar33 - (long)pSVar28) / 0xa8); lVar46 = lVar46 + 1)
      {
        pVVar27 = VertexPacketAllocator::alloc(vpalloc);
        pVVar34 = VertexPacketAllocator::alloc(vpalloc);
        pTVar31 = (TriangleVertex *)VertexPacketAllocator::alloc(vpalloc);
        mid1.position.m_data[1]._0_4_ = SUB84(pVVar34,0);
        mid1.position.m_data[1]._4_4_ = (float)((ulong)pVVar34 >> 0x20);
        mid1.position.m_data[2]._0_4_ = (int)pTVar31;
        mid1.position.m_data[2]._4_4_ = (undefined4)((ulong)pTVar31 >> 0x20);
        mid1.position.m_data[3] = (double)CONCAT44(mid1.position.m_data[3]._4_4_,0xffffffff);
        pdVar3 = pSVar28[lVar46].vertices[0].position.m_data + 2;
        dVar58 = *pdVar3;
        dVar17 = pdVar3[1];
        *(ulong *)(pVVar27->position).m_data =
             CONCAT44((float)pSVar28[lVar46].vertices[0].position.m_data[1],
                      (float)pSVar28[lVar46].vertices[0].position.m_data[0]);
        *(ulong *)((pVVar27->position).m_data + 2) = CONCAT44((float)dVar17,(float)dVar58);
        pdVar3 = pSVar28[lVar46].vertices[1].position.m_data + 2;
        dVar58 = *pdVar3;
        dVar17 = pdVar3[1];
        *(ulong *)(pVVar34->position).m_data =
             CONCAT44((float)pSVar28[lVar46].vertices[1].position.m_data[1],
                      (float)pSVar28[lVar46].vertices[1].position.m_data[0]);
        *(ulong *)((pVVar34->position).m_data + 2) = CONCAT44((float)dVar17,(float)dVar58);
        pdVar3 = pSVar28[lVar46].vertices[2].position.m_data + 2;
        auVar61._12_4_ = (float)pdVar3[1];
        auVar61._8_4_ = (float)*pdVar3;
        auVar61._0_4_ = (float)pSVar28[lVar46].vertices[2].position.m_data[0];
        auVar61._4_4_ = (float)pSVar28[lVar46].vertices[2].position.m_data[1];
        *(undefined1 (*) [16])((pTVar31->position).m_data + 1) = auVar61;
        lVar44 = 0;
        local_348 = pTVar31;
        mid1.position.m_data[0] = (double)pVVar27;
        for (in_stack_fffffffffffffc38 = (pointer)0x0;
            in_stack_fffffffffffffc38 <
            (pointer)((long)*(pointer *)(pGVar48 + 8) - *(long *)pGVar48 >> 3);
            in_stack_fffffffffffffc38 =
                 (pointer)((long)(in_stack_fffffffffffffc38->position).m_data + 1)) {
          if (*(int *)(*(long *)pGVar48 + lVar44) == 0) {
            pTVar42 = (primList->
                      super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (double *)((long)&(pTVar42[lVar47].v0)->outputs[0].v + lVar44 * 2);
            mid2.position.m_data[0] = *pdVar3;
            mid2.position.m_data[1] = pdVar3[1];
            pdVar3 = (double *)((long)&(pTVar42[lVar47].v1)->outputs[0].v + lVar44 * 2);
            approximatedClipPoint.m_data[0] = *pdVar3;
            approximatedClipPoint.m_data[1] = pdVar3[1];
            pdVar3 = (double *)((long)&(pTVar42[lVar47].v2)->outputs[0].v + lVar44 * 2);
            anotherPointOnLine.m_data[0] = *pdVar3;
            anotherPointOnLine.m_data[1] = pdVar3[1];
            tcu::operator*((tcu *)&local_3a8,(float)pSVar28[lVar46].vertices[0].weight[0],
                           (Vector<float,_4> *)&mid2);
            tcu::operator*((tcu *)&local_1c0,(float)pSVar28[lVar46].vertices[0].weight[1],
                           (Vector<float,_4> *)&approximatedClipPoint);
            tcu::operator+((tcu *)&nextPhaseSubTriangles,(Vector<float,_4> *)&local_3a8,
                           (Vector<float,_4> *)&local_1c0);
            tcu::operator*((tcu *)&renderTargetRect,(float)pSVar28[lVar46].vertices[0].weight[2],
                           (Vector<float,_4> *)&anotherPointOnLine);
            tcu::operator+((tcu *)local_368,(Vector<float,_4> *)&nextPhaseSubTriangles,
                           (Vector<float,_4> *)&renderTargetRect);
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2) = local_368._0_4_;
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 4) = local_368._4_4_;
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 8) = (undefined4)uStack_360;
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 0xc) = uStack_360._4_4_;
            tcu::operator*((tcu *)&local_3a8,(float)pSVar28[lVar46].vertices[1].weight[0],
                           (Vector<float,_4> *)&mid2);
            tcu::operator*((tcu *)&local_1c0,(float)pSVar28[lVar46].vertices[1].weight[1],
                           (Vector<float,_4> *)&approximatedClipPoint);
            tcu::operator+((tcu *)&nextPhaseSubTriangles,(Vector<float,_4> *)&local_3a8,
                           (Vector<float,_4> *)&local_1c0);
            tcu::operator*((tcu *)&renderTargetRect,(float)pSVar28[lVar46].vertices[1].weight[2],
                           (Vector<float,_4> *)&anotherPointOnLine);
            tcu::operator+((tcu *)local_368,(Vector<float,_4> *)&nextPhaseSubTriangles,
                           (Vector<float,_4> *)&renderTargetRect);
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2) = local_368._0_4_;
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 4) = local_368._4_4_;
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 8) = (undefined4)uStack_360;
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 0xc) = uStack_360._4_4_;
            tcu::operator*((tcu *)&local_3a8,(float)pSVar28[lVar46].vertices[2].weight[0],
                           (Vector<float,_4> *)&mid2);
            tcu::operator*((tcu *)&local_1c0,(float)pSVar28[lVar46].vertices[2].weight[1],
                           (Vector<float,_4> *)&approximatedClipPoint);
            tcu::operator+((tcu *)&nextPhaseSubTriangles,(Vector<float,_4> *)&local_3a8,
                           (Vector<float,_4> *)&local_1c0);
            tcu::operator*((tcu *)&renderTargetRect,(float)pSVar28[lVar46].vertices[2].weight[2],
                           (Vector<float,_4> *)&anotherPointOnLine);
            tcu::operator+((tcu *)local_368,(Vector<float,_4> *)&nextPhaseSubTriangles,
                           (Vector<float,_4> *)&renderTargetRect);
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2) = local_368._0_4_;
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 4) = local_368._4_4_;
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 8) = (undefined4)uStack_360;
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 0xc) = uStack_360._4_4_;
          }
          else {
            pVVar35 = pa::Triangle::getProvokingVertex
                                ((primList->
                                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar47);
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2);
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 4) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 4);
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 8) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 8);
            *(undefined4 *)((long)&pVVar27->outputs[0].v + lVar44 * 2 + 0xc) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 0xc);
            pVVar35 = pa::Triangle::getProvokingVertex
                                ((primList->
                                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar47);
            pTVar31 = local_348;
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2);
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 4) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 4);
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 8) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 8);
            *(undefined4 *)((long)&pVVar34->outputs[0].v + lVar44 * 2 + 0xc) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 0xc);
            pVVar35 = pa::Triangle::getProvokingVertex
                                ((primList->
                                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar47);
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2);
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 4) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 4);
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 8) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 8);
            *(undefined4 *)((long)pTVar31->weight + lVar44 * 2 + 0xc) =
                 *(undefined4 *)((long)&pVVar35->outputs[0].v + lVar44 * 2 + 0xc);
          }
          lVar44 = lVar44 + 8;
        }
        std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::push_back
                  (&outputTriangles,(value_type *)&mid1);
      }
      std::
      vector<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
      ::~vector((vector<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                 *)&depthValues);
    }
    else {
      std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::push_back
                (&outputTriangles,
                 (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)
                 ._M_impl.super__Vector_impl_data._M_start + lVar47);
    }
LAB_002e1d4e:
    lVar47 = lVar47 + 1;
  }
  pTVar14 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_start =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar42;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar12;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar14;
  std::_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::~_Vector_base
            (&outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>);
  for (pTVar42 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
      pTVar42 !=
      (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
      super__Vector_impl_data._M_finish; pTVar42 = pTVar42 + 1) {
    anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar42->v0);
    anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar42->v1);
    anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar42->v2);
  }
  pFVar15 = (local_338->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pFVar16 = (local_338->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar22 = *(int *)&renderTarget->field_0x8;
  local_3a8.
  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&(state->viewport).rect;
  local_3a8.
  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(state->viewport).rect.width;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&mid1,(MultisamplePixelBufferAccess *)renderTarget
            );
  local_1c0.m_data[0] = 0;
  local_1c0.m_data[1] = 0;
  local_1c0.m_data[3] = mid1.position.m_data[2]._0_4_;
  local_1c0.m_data[2] = (int)mid1.position.m_data[1]._4_4_;
  anon_unknown_19::rectIntersection((IVec4 *)&local_3a8,&local_1c0);
  std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::vector
            ((vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)&anotherPointOnLine,
             0x80,(allocator_type *)&mid1);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)local_368,
             ((long)pFVar15 - (long)pFVar16) * 0x40000000 >> 0x17,(allocator_type *)&mid1);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)&outputTriangles,0x200,
             (allocator_type *)&mid1);
  std::vector<float,_std::allocator<float>_>::vector(&depthValues,0,(allocator_type *)&mid1);
  mid2.weight[2] = 0.0;
  mid2.weight._0_16_ = ZEXT816(0);
  mid2.position.m_data[2] = 0.0;
  mid2.position.m_data[3] = 0.0;
  mid2.position.m_data[0] = 0.0;
  mid2.position.m_data[1] = 0.0;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&mid1,&renderTarget->m_depthBuffer);
  if (((mid1.position.m_data[1]._0_4_ == 0.0) || (mid1.position.m_data[1]._4_4_ == 0.0)) ||
     (mid1.position.m_data[2]._0_4_ == 0)) {
    pfVar36 = (float *)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(&depthValues,(long)iVar22 << 9);
    pfVar36 = depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  CVar21 = mid2.weight[2];
  dVar20 = mid2.position.m_data[3];
  dVar19 = mid2.position.m_data[2];
  dVar17 = mid2.position.m_data[1];
  dVar58 = mid2.position.m_data[0];
  mid2.position.m_data[2] = anotherPointOnLine.m_data[2];
  mid2.position.m_data[0] = anotherPointOnLine.m_data[0];
  mid2.position.m_data[1] = anotherPointOnLine.m_data[1];
  anotherPointOnLine.m_data[0] = dVar58;
  anotherPointOnLine.m_data[1] = dVar17;
  anotherPointOnLine.m_data[2] = dVar19;
  mid2.position.m_data[3] = (double)local_368;
  local_368 = (undefined1  [8])dVar20;
  uStack_360 = (pointer)mid2.weight[0];
  local_358 = (pointer)mid2.weight[1];
  mid2.weight[2] =
       (ClipFloat)
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CVar21;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar42 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pTVar42 ==
        (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      anon_unknown_19::RasterizationInternalBuffers::~RasterizationInternalBuffers
                ((RasterizationInternalBuffers *)&mid2);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&depthValues.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>::~_Vector_base
                ((_Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_> *)&outputTriangles);
      std::_Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::~_Vector_base
                ((_Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)local_368);
      std::_Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::~_Vector_base
                ((_Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)
                 &anotherPointOnLine);
      return;
    }
    iVar22 = *(int *)&renderTarget->field_0x8;
    fVar53 = (state->viewport).zn;
    fVar4 = (state->viewport).zf;
    TriangleRasterizer::TriangleRasterizer
              ((TriangleRasterizer *)&mid1,&renderTargetRect,iVar22,&state->rasterization);
    TriangleRasterizer::init((TriangleRasterizer *)&mid1,(EVP_PKEY_CTX *)&pTVar42->v0->position);
    if ((state->cullMode != CULLMODE_FRONT || local_c8 != FACETYPE_FRONT) &&
       (local_c8 != FACETYPE_BACK || state->cullMode != CULLMODE_BACK)) {
      FragmentShadingContext::FragmentShadingContext
                ((FragmentShadingContext *)planes,pTVar42->v0->outputs,pTVar42->v1->outputs,
                 pTVar42->v2->outputs,(GenericVec4 *)mid2.position.m_data[3],pfVar36,
                 (int)((ulong)((long)(local_338->fragmentShader->m_outputs).
                                     super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_338->fragmentShader->m_outputs).
                                    super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),iVar22,local_c8
                 ,(FaceType)in_stack_fffffffffffffc38);
      fVar55 = 0.0;
      if ((pfVar36 != (float *)0x0) && ((state->fragOps).polygonOffsetEnabled == true)) {
        fVar54 = anon_unknown_19::findTriangleVertexDepthSlope
                           (&pTVar42->v0->position,&pTVar42->v1->position,&pTVar42->v2->position);
        fVar55 = anon_unknown_19::findTriangleVertexDepthSlope
                           (&pTVar42->v1->position,&pTVar42->v2->position,&pTVar42->v0->position);
        local_348 = (TriangleVertex *)CONCAT44(extraout_XMM0_Db,fVar55);
        fVar56 = anon_unknown_19::findTriangleVertexDepthSlope
                           (&pTVar42->v2->position,&pTVar42->v0->position,&pTVar42->v1->position);
        MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  ((MultisampleConstPixelBufferAccess *)&approximatedClipPoint,
                   &renderTarget->m_depthBuffer);
        fVar55 = (pTVar42->v0->position).m_data[2];
        fVar62 = (pTVar42->v1->position).m_data[2];
        fVar57 = (pTVar42->v2->position).m_data[2];
        clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane =
             (ClipVolumePlane)(ClipVolumePlane)approximatedClipPoint.m_data[0];
        fVar26 = 0.0;
        channelType = (ChannelType)((ulong)approximatedClipPoint.m_data[0] >> 0x20);
        if (SUB84(approximatedClipPoint.m_data[0],0) == 0x14) {
          if (channelType == FLOAT_UNSIGNED_INT_24_8_REV) {
LAB_002e2249:
            uVar52 = -(uint)(fVar62 <= fVar55);
            fVar55 = (float)(~uVar52 & (uint)fVar62 | (uint)fVar55 & uVar52);
            uVar52 = -(uint)(fVar57 <= fVar55);
            nextPhaseSubTriangles.
            super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(nextPhaseSubTriangles.
                                   super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   ~uVar52 & (uint)fVar57 | uVar52 & (uint)fVar55);
            iVar23 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                               ((Float<unsigned_int,_8,_23,_127,_3U> *)&nextPhaseSubTriangles);
            fVar26 = (float)(iVar23 * 0x800000 + 0x34000000);
          }
          else if (channelType == UNSIGNED_INT_24_8) {
            fVar26 = 5.9604645e-08;
          }
        }
        else if (SUB84(approximatedClipPoint.m_data[0],0) == 0x12) {
          TVar25 = tcu::getTextureChannelClass(channelType);
          tcu::getTextureFormatBitDepth((tcu *)&nextPhaseSubTriangles,(TextureFormat *)&clipPosX);
          if (TVar25 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            if (channelType == FLOAT) goto LAB_002e2249;
          }
          else {
            fVar26 = (float)((int)nextPhaseSubTriangles.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::SubTriangle,_std::allocator<rr::(anonymous_namespace)::cliputil::SubTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_start * -0x800000 + 0x3f800000
                            );
          }
        }
        fVar55 = (float)(~-(uint)(fVar56 <= (float)local_348) & (uint)fVar56 |
                        -(uint)(fVar56 <= (float)local_348) & (uint)(float)local_348);
        uVar52 = -(uint)(fVar55 <= fVar54);
        fVar55 = (float)(uVar52 & (uint)fVar54 | ~uVar52 & (uint)fVar55) *
                 (state->fragOps).polygonOffsetFactor + fVar26 * (state->fragOps).polygonOffsetUnits
        ;
      }
      in_stack_fffffffffffffc38 = (pointer)(ulong)(uint)fVar55;
      fVar62 = (float)(~-(uint)(fVar53 <= fVar4) & (uint)fVar4 |
                      -(uint)(fVar53 <= fVar4) & (uint)fVar53);
      fVar53 = (float)(~-(uint)(fVar4 <= fVar53) & (uint)fVar4 |
                      (uint)fVar53 & -(uint)(fVar4 <= fVar53));
      while( true ) {
        approximatedClipPoint.m_data[0] =
             (double)((ulong)approximatedClipPoint.m_data[0] & 0xffffffff00000000);
        TriangleRasterizer::rasterize
                  ((TriangleRasterizer *)&mid1,(FragmentPacket *)mid2.position.m_data[0],pfVar36,
                   (int)((ulong)((long)mid2.position.m_data[1] - (long)mid2.position.m_data[0]) >> 6
                        ),(int *)&approximatedClipPoint);
        if (approximatedClipPoint.m_data[0]._0_4_ == 0) break;
        if ((pfVar36 != (float *)0x0) && ((state->fragOps).polygonOffsetEnabled == true)) {
          uVar52 = approximatedClipPoint.m_data[0]._0_4_ * iVar22 * 4;
          uVar51 = (ulong)uVar52;
          if ((int)uVar52 < 1) {
            uVar51 = 0;
          }
          for (uVar32 = 0; uVar51 != uVar32; uVar32 = uVar32 + 1) {
            fVar57 = pfVar36[uVar32] + fVar55;
            fVar4 = 1.0;
            if (fVar57 <= 1.0) {
              fVar4 = fVar57;
            }
            pfVar36[uVar32] = (float)(~-(uint)(fVar57 < 0.0) & (uint)fVar4);
          }
        }
        (**local_338->fragmentShader->_vptr_FragmentShader)
                  (local_338->fragmentShader,mid2.position.m_data[0],
                   (ulong)approximatedClipPoint.m_data[0] & 0xffffffff,
                   (FragmentShadingContext *)planes);
        if ((pfVar36 != (float *)0x0) && ((state->fragOps).depthClampEnabled == true)) {
          uVar52 = approximatedClipPoint.m_data[0]._0_4_ * iVar22 * 4;
          uVar51 = (ulong)uVar52;
          if ((int)uVar52 < 1) {
            uVar51 = 0;
          }
          for (uVar32 = 0; uVar51 != uVar32; uVar32 = uVar32 + 1) {
            fVar4 = pfVar36[uVar32];
            fVar57 = fVar53;
            if (fVar4 <= fVar53) {
              fVar57 = fVar4;
            }
            uVar52 = -(uint)(fVar4 < fVar62);
            pfVar36[uVar32] = (float)(uVar52 & (uint)fVar62 | ~uVar52 & (uint)fVar57);
          }
        }
        anon_unknown_19::writeFragmentPackets
                  (state,renderTarget,local_338,(FragmentPacket *)mid2.position.m_data[0],
                   approximatedClipPoint.m_data[0]._0_4_,local_c8,
                   (vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)
                   (mid2.position.m_data + 3),pfVar36,
                   (vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)(mid2.weight + 2));
      }
    }
    pTVar42 = pTVar42 + 1;
  } while( true );
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}